

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_01;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_02;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_03;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_04;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_05;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_06;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_07;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_08;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_09;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_10;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __b_11;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last_00;
  anon_class_8_1_8991fb9c comp_00;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  difference_type dVar4;
  pair<int,_int> *ppVar5;
  int in_ECX;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_RDX;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_RSI;
  HPresolve *in_RDI;
  undefined1 in_R8B;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar6;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  pivot_pos;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  byte bVar7;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffcf0;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd08;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd10;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd18;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd30;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd40;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd58;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd60;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd68;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_118 [2];
  pair<int,_int> *local_108;
  HPresolve *local_100;
  pair<int,_int> *local_f8;
  pair<int,_int> *local_f0;
  HPresolve *local_e8;
  pair<int,_int> *local_d8;
  pair<int,_int> *local_d0;
  pair<int,_int> *local_c8;
  pair<int,_int> *local_b8;
  pair<int,_int> *local_b0;
  pair<int,_int> *local_a8;
  pair<int,_int> *local_98;
  pair<int,_int> *local_90;
  pair<int,_int> *local_88;
  pair<int,_int> *local_78;
  pair<int,_int> *local_70;
  HPresolve *local_68;
  long local_60;
  HPresolve *local_48;
  HPresolve *local_30;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_8;
  
  uVar8 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  local_8._M_current = (pair<int,_int> *)in_RDI;
  do {
    while( true ) {
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)in_stack_fffffffffffffcd0._M_current,
                         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      if (dVar3 < 0x18) {
        if ((uVar8 & 0x1000000) == 0) {
          local_48 = (HPresolve *)local_8._M_current;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd00._M_current);
        }
        else {
          local_30 = (HPresolve *)local_8._M_current;
          insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                     (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd00._M_current);
        }
        return;
      }
      local_60 = dVar3 / 2;
      if (dVar3 < 0x81) {
        local_f8 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_100 = (HPresolve *)local_8._M_current;
        local_108 = (pair<int,_int> *)
                    __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
      }
      else {
        local_68 = (HPresolve *)local_8._M_current;
        local_70 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_78 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_88 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_90 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_98 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_a8 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b0 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b8 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_c8 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d0 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d8 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        local_e8 = (HPresolve *)local_8._M_current;
        local_f0 = (pair<int,_int> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        __b._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffcd0,__b);
      }
      bVar7 = 0;
      if ((uVar8 & 0x1000000) == 0) {
        local_118[0] = __gnu_cxx::
                       __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                   in_stack_fffffffffffffcd0._M_current);
        in_stack_fffffffffffffce0.this =
             (HPresolve *)
             __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(local_118);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator*(&local_8);
        bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd68._M_current,
                           in_stack_fffffffffffffd60._M_current,in_stack_fffffffffffffd58._M_current
                          );
        bVar7 = bVar1 ^ 0xff;
      }
      if ((bVar7 & 1) == 0) break;
      partition_left<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
      local_8 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                            in_stack_fffffffffffffcd0._M_current);
    }
    pVar6 = partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd30._M_current);
    in_stack_fffffffffffffd00 = pVar6.first._M_current;
    dVar4 = __gnu_cxx::operator-
                      ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_fffffffffffffcd0._M_current,
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                (difference_type)in_stack_fffffffffffffcd0._M_current);
    ppVar5 = (pair<int,_int> *)
             __gnu_cxx::operator-
                       (in_stack_fffffffffffffcd0._M_current,
                        (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    bVar1 = dVar3 / 8 <= dVar4;
    if (bVar1) {
      in_stack_fffffffffffffcd0._M_current = ppVar5;
    }
    bVar1 = !bVar1;
    bVar2 = (long)ppVar5 < dVar3 / 8;
    in_stack_fffffffffffffcdf = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      in_ECX = in_ECX + -1;
      if (in_ECX == 0) {
        __last._M_current._7_1_ = bVar7;
        __last._M_current._0_7_ = in_stack_fffffffffffffce8;
        std::
        make_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffcf0,__last,in_stack_fffffffffffffce0);
        __last_00._M_current._7_1_ = bVar7;
        __last_00._M_current._0_7_ = in_stack_fffffffffffffce8;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                  (in_stack_fffffffffffffcf0,__last_00,in_stack_fffffffffffffce0);
        return;
      }
      if (0x17 < dVar4) {
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_00._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_00._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffcd0,__b_00);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_01._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_01._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffcd0,__b_01);
        if (0x80 < dVar4) {
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_02._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_02._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_02);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_03._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_03._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_03);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_04._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_04._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_04);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_05._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_05._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_05);
        }
      }
      if (0x17 < (long)ppVar5) {
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_06._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_06._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffcd0,__b_06);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_07._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_07._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffcd0,__b_07);
        if (0x80 < (long)ppVar5) {
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_08._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_08._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_08);
          in_stack_fffffffffffffd68 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          in_stack_fffffffffffffd60 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          __b_09._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_09._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_09);
          in_stack_fffffffffffffd58 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_10._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_10._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_10);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          in_stack_fffffffffffffd40 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          __b_11._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_11._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    (in_stack_fffffffffffffcd0,__b_11);
        }
      }
    }
    else {
      bVar1 = false;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        in_stack_fffffffffffffd30._M_current = in_stack_fffffffffffffd00._M_current;
        in_stack_fffffffffffffd38._M_current = local_8._M_current;
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                          (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                           (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        bVar1 = false;
        if (bVar2) {
          in_stack_fffffffffffffd10._M_current = in_RDX._M_current;
          in_stack_fffffffffffffd18._M_current = in_RSI._M_current;
          in_stack_fffffffffffffd20 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                           in_stack_fffffffffffffcd0._M_current);
          in_RDX._M_current = in_stack_fffffffffffffd10._M_current;
          in_RSI._M_current = in_stack_fffffffffffffd18._M_current;
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                             (anon_class_8_1_8991fb9c)in_stack_fffffffffffffd08._M_current);
        }
      }
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffccf = 0;
    }
    comp_00.this._4_4_ = in_ECX;
    comp_00.this._0_4_ = uVar8;
    in_stack_fffffffffffffd08._M_current = local_8._M_current;
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
              (in_RSI,in_RDX,comp_00,(int)((ulong)dVar3 >> 0x20),SUB81((ulong)dVar3 >> 0x18,0));
    in_stack_fffffffffffffcf0 =
         __gnu_cxx::
         __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
         ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                     in_stack_fffffffffffffcd0._M_current);
    uVar8 = uVar8 & 0xffffff;
    local_8 = in_stack_fffffffffffffcf0;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }